

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

bool __thiscall
google::protobuf::internal::ThreadSafeArena::SerialArenaChunk::insert
          (SerialArenaChunk *this,void *me,SerialArena *serial)

{
  uint i;
  uint32_t uVar1;
  uint32_t uVar2;
  atomic<unsigned_int> *paVar3;
  atomic<void_*> *this_00;
  atomic<google::protobuf::internal::SerialArena_*> *this_01;
  uint32_t idx;
  SerialArena *serial_local;
  void *me_local;
  SerialArenaChunk *this_local;
  memory_order __b;
  
  paVar3 = size(this);
  LOCK();
  i = (paVar3->super___atomic_base<unsigned_int>)._M_i;
  (paVar3->super___atomic_base<unsigned_int>)._M_i =
       (paVar3->super___atomic_base<unsigned_int>)._M_i + 1;
  UNLOCK();
  uVar1 = capacity(this);
  if (i < uVar1) {
    this_00 = id(this,i);
    std::atomic<void_*>::store(this_00,me,memory_order_relaxed);
    this_01 = arena(this,i);
    std::atomic<google::protobuf::internal::SerialArena_*>::store
              (this_01,serial,memory_order_release);
  }
  else {
    paVar3 = size(this);
    uVar2 = capacity(this);
    std::operator&(memory_order_relaxed,__memory_order_mask);
    (paVar3->super___atomic_base<unsigned_int>)._M_i = uVar2;
  }
  return i < uVar1;
}

Assistant:

bool insert(void* me, SerialArena* serial) {
    uint32_t idx = size().fetch_add(1, std::memory_order_relaxed);
    // Bail out if this chunk is full.
    if (idx >= capacity()) {
      // Write old value back to avoid potential overflow.
      size().store(capacity(), std::memory_order_relaxed);
      return false;
    }

    id(idx).store(me, std::memory_order_relaxed);
    arena(idx).store(serial, std::memory_order_release);
    return true;
  }